

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.cpp
# Opt level: O2

string * __thiscall pbrt::Ray::ToString_abi_cxx11_(string *__return_storage_ptr__,Ray *this)

{
  MediumHandle *unaff_RBX;
  
  StringPrintf<pbrt::Point3<float>const&,pbrt::Vector3<float>const&,float_const&,pbrt::MediumHandle_const&>
            (__return_storage_ptr__,(pbrt *)"[ o: %s d: %s time: %f, medium: %s ]",(char *)this,
             (Point3<float> *)&this->d,(Vector3<float> *)&this->time,(float *)&this->medium,
             unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string Ray::ToString() const {
    return StringPrintf("[ o: %s d: %s time: %f, medium: %s ]", o, d, time, medium);
}